

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

bool __thiscall
testing::internal::
OnCallSpec<int_(const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_unsigned_char)>
::Matches(OnCallSpec<int_(const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_unsigned_char)>
          *this,ArgumentTuple *args)

{
  bool bVar1;
  
  bVar1 = TuplePrefix<2ul>::
          Matches<std::tuple<testing::Matcher<std::unique_ptr<SDL_Texture,std::function<void(SDL_Texture*)>>const&>,testing::Matcher<unsigned_char>>,std::tuple<std::unique_ptr<SDL_Texture,std::function<void(SDL_Texture*)>>const&,unsigned_char>>
                    ((tuple<testing::Matcher<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>,_testing::Matcher<unsigned_char>_>
                      *)(this + 0x10),args);
  if (bVar1) {
    bVar1 = MatcherBase<const_std::tuple<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_unsigned_char>_&>
            ::Matches((MatcherBase<const_std::tuple<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_unsigned_char>_&>
                       *)(this + 0x40),args);
    return bVar1;
  }
  return false;
}

Assistant:

bool Matches(const ArgumentTuple& args) const {
    return TupleMatches(matchers_, args) && extra_matcher_.Matches(args);
  }